

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O0

bool __thiscall cali::Node::equals(Node *this,cali_id_t attr,Variant *v)

{
  bool bVar1;
  bool local_21;
  Variant *v_local;
  cali_id_t attr_local;
  Node *this_local;
  
  bVar1 = cali::operator==(&this->m_data,v);
  local_21 = false;
  if (bVar1) {
    local_21 = this->m_attribute == attr;
  }
  return local_21;
}

Assistant:

bool equals(cali_id_t attr, const Variant& v) const { return m_data == v && m_attribute == attr; }